

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

void ft_glyphslot_done(FT_GlyphSlot slot)

{
  FT_UInt *pFVar1;
  FT_Driver pFVar2;
  FT_Memory pFVar3;
  FT_Driver_Class pFVar4;
  undefined8 *puVar5;
  void *pvVar6;
  FT_Slot_DoneFunc p_Var7;
  FT_GlyphLoader loader;
  FT_Memory pFVar8;
  
  pFVar2 = slot->face->driver;
  pFVar3 = (pFVar2->root).memory;
  pFVar4 = pFVar2->clazz;
  if ((slot->face->face_flags & 0x10000) != 0) {
    if ((slot->internal != (FT_Slot_Internal)0x0) && ((slot->internal->flags & 2) != 0)) {
      puVar5 = (undefined8 *)slot->other;
      pvVar6 = (void *)*puVar5;
      if (pvVar6 != (void *)0x0) {
        (*pFVar3->free)(pFVar3,pvVar6);
      }
      *puVar5 = 0;
      pFVar1 = &slot->internal->flags;
      *pFVar1 = *pFVar1 & 0xfffffffd;
    }
    if (slot->other != (void *)0x0) {
      (*pFVar3->free)(pFVar3,slot->other);
    }
    slot->other = (void *)0x0;
  }
  p_Var7 = pFVar4->done_slot;
  if (p_Var7 != (FT_Slot_DoneFunc)0x0) {
    (*p_Var7)(slot);
  }
  ft_glyphslot_free_bitmap(slot);
  if (slot->internal != (FT_Slot_Internal)0x0) {
    if ((((pFVar2->root).clazz)->module_flags & 0x200) == 0) {
      loader = slot->internal->loader;
      if (loader != (FT_GlyphLoader)0x0) {
        pFVar8 = loader->memory;
        FT_GlyphLoader_Reset(loader);
        (*pFVar8->free)(pFVar8,loader);
      }
      slot->internal->loader = (FT_GlyphLoader)0x0;
    }
    if (slot->internal != (FT_Slot_Internal)0x0) {
      (*pFVar3->free)(pFVar3,slot->internal);
    }
    slot->internal = (FT_Slot_Internal)0x0;
  }
  return;
}

Assistant:

static void
  ft_glyphslot_done( FT_GlyphSlot  slot )
  {
    FT_Driver        driver = slot->face->driver;
    FT_Driver_Class  clazz  = driver->clazz;
    FT_Memory        memory = driver->root.memory;

#ifdef FT_CONFIG_OPTION_SVG
    if ( slot->face->face_flags & FT_FACE_FLAG_SVG )
    {
      /* Free memory in case SVG was there.                          */
      /* `slot->internal` might be NULL in out-of-memory situations. */
      if ( slot->internal && slot->internal->flags & FT_GLYPH_OWN_GZIP_SVG )
      {
        FT_SVG_Document  doc = (FT_SVG_Document)slot->other;


        FT_FREE( doc->svg_document );

        slot->internal->flags &= ~FT_GLYPH_OWN_GZIP_SVG;
      }

      FT_FREE( slot->other );
    }
#endif

    if ( clazz->done_slot )
      clazz->done_slot( slot );

    /* free bitmap buffer if needed */
    ft_glyphslot_free_bitmap( slot );

    /* slot->internal might be NULL in out-of-memory situations */
    if ( slot->internal )
    {
      /* free glyph loader */
      if ( FT_DRIVER_USES_OUTLINES( driver ) )
      {
        FT_GlyphLoader_Done( slot->internal->loader );
        slot->internal->loader = NULL;
      }

      FT_FREE( slot->internal );
    }
  }